

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O0

int remoteConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_named_traits *pmVar2;
  mpt_type_t local_40;
  mpt_type_t me;
  mpt_named_traits *traits;
  mpt_out_data *od;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  pmVar2 = mpt_input_type_traits();
  if (pmVar2 == (mpt_named_traits *)0x0) {
    local_40 = 0x100;
  }
  else {
    local_40 = pmVar2->type;
    if (type == local_40) {
      if (ptr != (void *)0x0) {
        *(mpt_convertable **)ptr = val;
      }
      return 1;
    }
  }
  val_local._4_4_ = (int)local_40;
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(uint8_t **)ptr = remoteConv::fmt;
    }
  }
  else if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val;
    }
    val_local._4_4_ = 1;
  }
  else if (type == 1) {
    if (ptr != (void *)0x0) {
      iVar1 = remote_infile((mpt_out_data *)val);
      *(int *)ptr = iVar1;
    }
  }
  else if (type == 0x84) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
  }
  else if (type == 0x83) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 2;
    }
  }
  else if (type == 0x81) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 3;
    }
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int remoteConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	const MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, val, _in);
	const MPT_STRUCT(named_traits) *traits = mpt_input_type_traits();
	MPT_TYPE(type) me;
	
	if (!traits) {
		me = MPT_ENUM(TypeMetaPtr);
	}
	else if (type == (me = traits->type)) {
		if (ptr) *((const void **) ptr) = &od->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (!type) {
		static const uint8_t fmt[] = {
			MPT_ENUM(TypeObjectPtr),
			MPT_ENUM(TypeOutputPtr),
			MPT_ENUM(TypeLoggerPtr),
			0
		};
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
		}
		return me;
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((const void **) ptr) = &od->_in;
		return MPT_ENUM(TypeUnixSocket);
	}
	if (type == MPT_ENUM(TypeUnixSocket)) {
		if (ptr) *((int *) ptr) = remote_infile(od);
		return me;
	}
	if (type == MPT_ENUM(TypeObjectPtr)) {
		if (ptr) *((const void **) ptr) = &od->_obj;
		return me;
	}
	if (type == MPT_ENUM(TypeOutputPtr)) {
		if (ptr) *((const void **) ptr) = &od->_out;
		return me;
	}
	if (type == MPT_ENUM(TypeLoggerPtr)) {
		if (ptr) *((const void **) ptr) = &od->_log;
		return me;
	}
	return MPT_ERROR(BadType);
}